

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_utilities.h
# Opt level: O2

bool Gudhi::persistence_matrix::
     _add_to_column<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
               (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                *source,Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                        *targetColumn)

{
  bool bVar1;
  anon_class_1_0_00000001 local_c;
  anon_class_1_0_00000001 local_b;
  anon_class_1_0_00000001 local_a;
  anon_class_1_0_00000001 local_9;
  anon_class_8_1_e4bd5e45 local_8;
  
  local_8.targetColumn = targetColumn;
  bVar1 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>(Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>___rue,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>__Matrix_column_tag_3u>_false>___1_>
                    (source,targetColumn,&local_9,&local_8,&local_a,&local_b,&local_c);
  return bVar1;
}

Assistant:

bool _add_to_column(const Entry_range& source, Column& targetColumn)
{
  return _generic_add_to_column(
      source,
      targetColumn,
      [&]([[maybe_unused]] typename Column::Entry* entryTarget) {},
      [&](typename Entry_range::const_iterator& itSource, const typename Column::Column_support::iterator& itTarget) {
        if constexpr (Column::Master::Option_list::is_z2) {
          targetColumn._insert_entry(itSource->get_row_index(), itTarget);
        } else {
          targetColumn._insert_entry(itSource->get_element(), itSource->get_row_index(), itTarget);
        }
      },
      [&](typename Column::Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        if constexpr (!Column::Master::Option_list::is_z2)
          targetColumn.operators_->add_inplace(targetElement, itSource->get_element());
      },
      [&]([[maybe_unused]] typename Column::Entry* entryTarget) {},
      [&]([[maybe_unused]] typename Column::Column_support::iterator& itTarget) {}
    );
}